

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utLWOImportExport.cpp
# Opt level: O0

void __thiscall utLWOImportExport::~utLWOImportExport(utLWOImportExport *this)

{
  code *pcVar1;
  utLWOImportExport *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual bool importerTest() {
        Assimp::Importer importer;
        const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/LWO/LWO2/boxuv.lwo", aiProcess_ValidateDataStructure);

        EXPECT_EQ(1u, scene->mNumMeshes);
        EXPECT_NE(nullptr, scene->mMeshes[0]);
        EXPECT_EQ(24u, scene->mMeshes[0]->mNumVertices);

        //This test model is using n-gons, so 6 faces instead of 12 tris
        EXPECT_EQ(6u, scene->mMeshes[0]->mNumFaces);
        EXPECT_EQ(aiPrimitiveType_POLYGON, scene->mMeshes[0]->mPrimitiveTypes);
        EXPECT_EQ(true, scene->mMeshes[0]->HasTextureCoords(0));

        return nullptr != scene;
    }